

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testUVProcessChain.cxx
# Opt level: O0

bool checkOutput(istream *outputStream,istream *errorStream)

{
  bool bVar1;
  long lVar2;
  ostream *poVar3;
  size_type qemu_error_pos;
  string error;
  undefined1 local_40 [8];
  string output;
  istream *errorStream_local;
  istream *outputStream_local;
  
  output.field_2._8_8_ = errorStream;
  getInput_abi_cxx11_((string *)local_40,outputStream);
  bVar1 = std::operator!=((string *)local_40,"HELO WRD!");
  if (bVar1) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Output was \"");
    poVar3 = std::operator<<(poVar3,(string *)local_40);
    poVar3 = std::operator<<(poVar3,"\", expected \"HELO WRD!\"");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    outputStream_local._7_1_ = false;
    error.field_2._8_4_ = 1;
    goto LAB_00238c23;
  }
  getInput_abi_cxx11_((string *)&qemu_error_pos,(istream *)output.field_2._8_8_);
  lVar2 = std::__cxx11::string::find((char *)&qemu_error_pos,0x121145b);
  if (lVar2 != -1) {
    std::__cxx11::string::resize((ulong)&qemu_error_pos);
  }
  lVar2 = std::__cxx11::string::length();
  if (lVar2 == 3) {
    lVar2 = std::__cxx11::string::find((char)&qemu_error_pos,0x31);
    if (lVar2 == -1) goto LAB_00238b9c;
    lVar2 = std::__cxx11::string::find((char)&qemu_error_pos,0x32);
    if (lVar2 == -1) goto LAB_00238b9c;
    lVar2 = std::__cxx11::string::find((char)&qemu_error_pos,0x33);
    if (lVar2 == -1) goto LAB_00238b9c;
    outputStream_local._7_1_ = true;
  }
  else {
LAB_00238b9c:
    poVar3 = std::operator<<((ostream *)&std::cout,"Error was \"");
    poVar3 = std::operator<<(poVar3,(string *)&qemu_error_pos);
    poVar3 = std::operator<<(poVar3,"\", expected \"123\"");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    outputStream_local._7_1_ = false;
  }
  error.field_2._8_4_ = 1;
  std::__cxx11::string::~string((string *)&qemu_error_pos);
LAB_00238c23:
  std::__cxx11::string::~string((string *)local_40);
  return outputStream_local._7_1_;
}

Assistant:

static bool checkOutput(std::istream& outputStream, std::istream& errorStream)
{
  std::string output = getInput(outputStream);
  if (output != "HELO WRD!") {
    std::cout << "Output was \"" << output << "\", expected \"HELO WRD!\""
              << std::endl;
    return false;
  }

  std::string error = getInput(errorStream);
  auto qemu_error_pos = error.find("qemu:");
  if (qemu_error_pos != std::string::npos) {
    error.resize(qemu_error_pos);
  }
  if (error.length() != 3 || error.find('1') == std::string::npos ||
      error.find('2') == std::string::npos ||
      error.find('3') == std::string::npos) {
    std::cout << "Error was \"" << error << "\", expected \"123\""
              << std::endl;
    return false;
  }

  return true;
}